

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simul.cpp
# Opt level: O1

Simulation * MetaSim::Simulation::getInstance(void)

{
  Simulation *this;
  
  if (instance_ == (Simulation *)0x0) {
    this = (Simulation *)operator_new(0x80);
    DebugStream::DebugStream((DebugStream *)this);
    *(undefined8 *)((long)&this->actRuns + 1) = 0;
    *(undefined8 *)((long)&(this->globTime).v + 1) = 0;
    this->numRuns = 0;
    this->actRuns = 0;
    instance_ = this;
  }
  return instance_;
}

Assistant:

Simulation& Simulation::getInstance()
    {
        if (instance_ == 0) instance_ = new Simulation();
                
        return *instance_;
    }